

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_agg.cpp
# Opt level: O2

AggregateFunctionSet * duckdb::StringAggFun::GetFunctions(void)

{
  vector<duckdb::AggregateFunction,_true> *this;
  AggregateFunctionSet *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_401;
  LogicalType local_400;
  LogicalType local_3e8;
  LogicalType local_3d0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3b8;
  AggregateFunction string_agg_param;
  AggregateFunction local_270;
  AggregateFunction local_140;
  
  AggregateFunctionSet::AggregateFunctionSet(in_RDI);
  LogicalType::LogicalType(&local_3e8,VARCHAR);
  LogicalType::ANY_PARAMS(&local_3d0,&local_3e8,5);
  __l._M_len = 1;
  __l._M_array = &local_3d0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_3b8,__l,&local_401);
  LogicalType::LogicalType(&local_400,VARCHAR);
  AggregateFunction::AggregateFunction
            (&string_agg_param,(vector<duckdb::LogicalType,_true> *)&local_3b8,&local_400,
             AggregateFunction::StateSize<duckdb::StringAggState>,
             AggregateFunction::
             StateInitialize<duckdb::StringAggState,duckdb::StringAggFunction,(duckdb::AggregateDestructorType)0>
             ,AggregateFunction::
              UnaryScatterUpdate<duckdb::StringAggState,duckdb::string_t,duckdb::StringAggFunction>,
             AggregateFunction::StateCombine<duckdb::StringAggState,duckdb::StringAggFunction>,
             AggregateFunction::
             StateFinalize<duckdb::StringAggState,duckdb::string_t,duckdb::StringAggFunction>,
             AggregateFunction::
             UnaryUpdate<duckdb::StringAggState,duckdb::string_t,duckdb::StringAggFunction>,
             StringAggBind,(aggregate_destructor_t)0x0,(aggregate_statistics_t)0x0,
             (aggregate_window_t)0x0,(aggregate_serialize_t)0x0,(aggregate_deserialize_t)0x0);
  LogicalType::~LogicalType(&local_400);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3b8);
  LogicalType::~LogicalType(&local_3d0);
  LogicalType::~LogicalType(&local_3e8);
  string_agg_param.serialize = StringAggSerialize;
  string_agg_param.deserialize = StringAggDeserialize;
  AggregateFunction::AggregateFunction(&local_140,&string_agg_param);
  this = &(in_RDI->super_FunctionSet<duckdb::AggregateFunction>).functions;
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_140);
  AggregateFunction::~AggregateFunction(&local_140);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)
             &string_agg_param.super_BaseScalarFunction.super_SimpleFunction.arguments,
             &LogicalType::VARCHAR);
  AggregateFunction::AggregateFunction(&local_270,&string_agg_param);
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_270);
  AggregateFunction::~AggregateFunction(&local_270);
  AggregateFunction::~AggregateFunction(&string_agg_param);
  return in_RDI;
}

Assistant:

AggregateFunctionSet StringAggFun::GetFunctions() {
	AggregateFunctionSet string_agg;
	AggregateFunction string_agg_param(
	    {LogicalType::ANY_PARAMS(LogicalType::VARCHAR)}, LogicalType::VARCHAR,
	    AggregateFunction::StateSize<StringAggState>,
	    AggregateFunction::StateInitialize<StringAggState, StringAggFunction>,
	    AggregateFunction::UnaryScatterUpdate<StringAggState, string_t, StringAggFunction>,
	    AggregateFunction::StateCombine<StringAggState, StringAggFunction>,
	    AggregateFunction::StateFinalize<StringAggState, string_t, StringAggFunction>,
	    AggregateFunction::UnaryUpdate<StringAggState, string_t, StringAggFunction>, StringAggBind);
	string_agg_param.serialize = StringAggSerialize;
	string_agg_param.deserialize = StringAggDeserialize;
	string_agg.AddFunction(string_agg_param);
	string_agg_param.arguments.emplace_back(LogicalType::VARCHAR);
	string_agg.AddFunction(string_agg_param);
	return string_agg;
}